

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.h
# Opt level: O1

string * __thiscall re2c::Opt::yychConversion_abi_cxx11_(string *__return_storage_ptr__,Opt *this)

{
  bool bVar1;
  long lVar2;
  opt_t *poVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  poVar3 = realopt_t::operator->(&this->realopt);
  bVar1 = poVar3->yychConversion;
  if (bVar1 == true) {
    poVar3 = realopt_t::operator->(&this->realopt);
    std::operator+(&local_38,"(",&poVar3->yyctype);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_38);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  if ((bVar1 != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2)) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string yychConversion ()
	{
		return realopt->yychConversion
			? "(" + realopt->yyctype + ")"
			: "";
	}